

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_WCVTF(TT_ExecContext exc,FT_Long *args)

{
  ulong uVar1;
  FT_Int32 FVar2;
  FT_ULong I;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = *args;
  if (uVar1 < exc->cvtSize) {
    FVar2 = FT_MulFix_x86_64((FT_Int32)args[1],(FT_Int32)(exc->tt_metrics).scale);
    exc->cvt[uVar1] = (long)FVar2;
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_WCVTF( TT_ExecContext  exc,
             FT_Long*        args )
  {
    FT_ULong  I = (FT_ULong)args[0];


    if ( BOUNDSL( I, exc->cvtSize ) )
    {
      if ( exc->pedantic_hinting )
        ARRAY_BOUND_ERROR;
    }
    else
      exc->cvt[I] = FT_MulFix( args[1], exc->tt_metrics.scale );
  }